

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  undefined4 uVar4;
  MemoryMonitorInterface *pMVar5;
  ThreadLocal2 *pTVar6;
  iterator iVar7;
  BBox1f *pBVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  undefined1 auVar11 [16];
  int iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  vint *pvVar15;
  unsigned_long uVar16;
  unsigned_long uVar17;
  BBox1f BVar18;
  char cVar19;
  long lVar20;
  long lVar21;
  SetMB *this_00;
  void *pvVar22;
  size_t sVar23;
  undefined8 *puVar24;
  runtime_error *prVar25;
  long lVar26;
  BBox1f BVar27;
  float *pfVar28;
  BBox1f *pBVar29;
  BBox1f BVar30;
  uint uVar31;
  ulong uVar32;
  char *pcVar33;
  ulong uVar34;
  BuildRecord *in_00;
  undefined8 uVar35;
  ulong uVar36;
  BBox1f BVar37;
  code *pcVar38;
  int iVar39;
  mvector<PrimRefMB> *prims;
  bool bVar40;
  undefined1 extraout_var [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  undefined1 auVar47 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  task_group_context *in_stack_ffffffffffffe188;
  undefined1 local_1e68 [16];
  BBox1f local_1e50;
  undefined1 local_1e48 [8];
  undefined8 uStack_1e40;
  undefined1 local_1e38 [8];
  undefined8 uStack_1e30;
  undefined1 local_1e28 [8];
  undefined8 uStack_1e20;
  undefined1 local_1e18 [8];
  undefined8 uStack_1e10;
  ulong local_1e00;
  undefined1 local_1df8 [8];
  undefined8 uStack_1df0;
  NodeRecordMB4D *local_1de8;
  ulong local_1de0;
  BBox1f local_1dd8;
  ulong local_1dd0;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  BBox<embree::Vec3fa> bi;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d48;
  BBox1f local_1d38;
  BBox1f BStack_1d30;
  float local_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  PrimInfoMB right;
  BBox<embree::Vec3fa> blower1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bf8;
  BBox1f local_1be8;
  char acStack_1be0 [16];
  BBox1f BStack_1bd0;
  BBox1f local_1bc8;
  BBox1f BStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  BBox1f local_1ba8;
  BBox1f BStack_1ba0;
  BBox1f local_1b98;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  anon_class_1_0_00000001 reduction;
  BBox<embree::Vec3fa> bupper0;
  undefined8 local_1b08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1b00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1af0;
  unsigned_long uStack_1ae0;
  unsigned_long local_1ad8;
  size_t sStack_1ad0;
  size_t local_1ac8;
  BBox1f BStack_1ac0;
  BBox1f local_1ab8;
  size_t sStack_1ab0;
  size_t local_1aa8;
  undefined8 uStack_1aa0;
  BBox1f local_1a98;
  BBox1f BStack_1a90;
  BBox1f local_1a88;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a38;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  BBox<embree::Vec3fa> blower0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1798;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  BBox1f local_1758 [2];
  undefined1 local_1748 [16];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  undefined8 local_838 [14];
  BBox1f aBStack_7c8 [49];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar34 = in->depth;
  local_1de8 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar34) {
    puVar24 = (undefined8 *)__cxa_allocate_exception(0x30);
    blower0.lower.field_0._0_8_ = &blower0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&blower0,"depth limit reached","");
    *puVar24 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar24 + 1) = 1;
    puVar24[2] = puVar24 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar24 + 2),blower0.lower.field_0._0_8_,
               CONCAT44(blower0.lower.field_0.m128[3],blower0.lower.field_0.m128[2]) +
               blower0.lower.field_0._0_8_);
    __cxa_throw(puVar24,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  _local_1e28 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128;
  local_1e38 = *(undefined1 (*) [8])
                &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.upper.field_0;
  uStack_1e30 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds0.upper.field_0 + 8);
  uVar13 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.lower.field_0;
  uVar14 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.lower.field_0 + 8);
  _local_1e48 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.upper.field_0.m128;
  _local_1e18 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 centBounds.lower.field_0.m128;
  _local_1df8 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 centBounds.upper.field_0.m128;
  BVar27 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar30 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  local_1a38._8_8_ = local_1a38._0_8_;
  local_1a38._0_8_ = in;
  BVar37 = (BBox1f)(in->prims).prims;
  uVar35 = &blower0;
  findFallback((Split *)uVar35,this,&in->prims);
  local_1718[0].mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  local_1718[0].mapping.num = blower0.upper.field_0._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0._0_8_ = local_1e28;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0._8_8_ = uStack_1e20;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._0_8_ = local_1e38;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._8_8_ = uStack_1e30;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._0_8_ = local_1e48;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._8_8_ = uStack_1e40;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._0_8_ = local_1e18;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._8_8_ = uStack_1e10;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._0_8_ = local_1df8;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._8_8_ = uStack_1df0;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar18 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)blower0.lower.field_0._0_4_;
  current.split.dim = blower0.lower.field_0._4_4_;
  current.split.mapping.num = blower0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  current.split.mapping.scale.field_0._0_8_ = local_1798._0_8_;
  current.split.mapping.scale.field_0._8_8_ = local_1798._8_8_;
  local_1de0 = (long)BVar30 - (long)BVar27;
  if (local_1de0 == 0 || uVar34 != 1) {
    uVar31 = 0;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar26 = (long)BVar30 - (long)BVar27;
    if ((ulong)BVar30 < (ulong)BVar27 || lVar26 == 0) {
      auVar43._0_12_ = ZEXT812(0x7f800000);
      auVar43._12_4_ = 0;
      fVar61 = -INFINITY;
    }
    else {
      pfVar28 = &(*(PrimRefMB **)((long)BVar37 + 0x20))[(long)BVar27].time_range.upper;
      fVar61 = -INFINITY;
      auVar43._0_12_ = ZEXT812(0x7f800000);
      auVar43._12_4_ = 0;
      do {
        if (((BBox1f *)(pfVar28 + -1))->lower <= auVar43._0_4_) {
          auVar43._0_4_ = ((BBox1f *)(pfVar28 + -1))->lower;
        }
        fVar57 = *pfVar28;
        if (*pfVar28 <= fVar61) {
          fVar57 = fVar61;
        }
        fVar61 = fVar57;
        pfVar28 = pfVar28 + 0x14;
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
    }
    uVar31 = -(uint)(fVar61 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper ||
                    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower <
                    auVar43._0_4_) & 0xffffff01;
  }
  current.super_BuildRecord.depth = uVar34;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0._0_8_ = uVar13;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0._8_8_ = uVar14;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)BVar27;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)BVar30;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar18;
  current.super_BuildRecord.prims.prims = (PrimRefVector)BVar37;
  if (((local_1de0 <= (this->cfg).maxLeafSize) && ((uint)blower0.lower.field_0._12_4_ < 2)) &&
     ((char)uVar31 == '\0')) {
    bupper0.lower.field_0._0_8_ = local_1de0 * 8;
    pTVar6 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar6;
      MutexSys::lock(&pTVar6->mutex);
      if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
             ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar6->alloc0).bytesUsed = 0;
      (pTVar6->alloc0).bytesWasted = 0;
      (pTVar6->alloc0).end = 0;
      (pTVar6->alloc0).allocBlockSize = 0;
      (pTVar6->alloc0).ptr = (char *)0x0;
      (pTVar6->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
      }
      else {
        (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar6->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower0.lower.field_0._8_1_ = 1;
      blower1.lower.field_0._0_8_ = pTVar6;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar7._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&blower1);
      }
      else {
        *iVar7._M_current = (ThreadLocal2 *)blower1.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    uVar35 = bupper0.lower.field_0._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + bupper0.lower.field_0._0_8_;
    sVar23 = (alloc.talloc1)->cur;
    uVar34 = (ulong)(-(int)sVar23 & 0xf);
    uVar32 = sVar23 + bupper0.lower.field_0._0_8_ + uVar34;
    (alloc.talloc1)->cur = uVar32;
    if ((alloc.talloc1)->end < uVar32) {
      (alloc.talloc1)->cur = sVar23;
      uVar34 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(bupper0.lower.field_0._0_8_ * 4) < uVar34 ||
          bupper0.lower.field_0._0_8_ * 4 - uVar34 == 0) {
        blower0.lower.field_0._0_8_ = uVar34;
        pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
        (alloc.talloc1)->ptr = pcVar33;
        sVar23 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar23;
        (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = uVar35;
        if ((ulong)blower0.lower.field_0._0_8_ < (ulong)uVar35) {
          (alloc.talloc1)->cur = 0;
          blower0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
          (alloc.talloc1)->ptr = pcVar33;
          sVar23 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar23;
          (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = uVar35;
          if ((ulong)blower0.lower.field_0._0_8_ < (ulong)uVar35) {
            (alloc.talloc1)->cur = 0;
            pcVar33 = (char *)0x0;
            goto LAB_00c67cc5;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar23;
      }
      else {
        pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&bupper0);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar34;
      pcVar33 = (alloc.talloc1)->ptr + (uVar32 - bupper0.lower.field_0._0_8_);
    }
LAB_00c67cc5:
    uVar34 = 7;
    if (local_1de0 < 7) {
      uVar34 = local_1de0;
    }
    local_1a38 = _DAT_01f7a9f0;
    aVar46 = _DAT_01f7aa00;
    aVar48 = _DAT_01f7aa00;
    aVar49 = _DAT_01f7a9f0;
    if (BVar30 != BVar27) {
      local_1e00 = 0;
      do {
        pSVar9 = ((this->createLeaf).bvh)->scene;
        fVar61 = (current.super_BuildRecord.prims.prims)->items[(long)BVar27].lbounds.bounds0.lower.
                 field_0.m128[3];
        uVar4 = *(undefined4 *)
                 ((long)&(current.super_BuildRecord.prims.prims)->items[(long)BVar27].lbounds.
                         bounds0.upper.field_0 + 0xc);
        *(float *)(pcVar33 + local_1e00 * 8) = fVar61;
        *(undefined4 *)(pcVar33 + local_1e00 * 8 + 4) = uVar4;
        pGVar10 = (pSVar9->geometries).items[(uint)fVar61].ptr;
        fVar61 = pGVar10->fnumTimeSegments;
        fVar57 = (pGVar10->time_range).lower;
        fVar60 = (pGVar10->time_range).upper - fVar57;
        fVar66 = (current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower - fVar57) /
                 fVar60;
        fVar60 = (current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper - fVar57) /
                 fVar60;
        local_1dd0 = CONCAT44(local_1dd0._4_4_,fVar61);
        _local_1e38 = ZEXT416((uint)(fVar61 * fVar66));
        fVar57 = fVar61 * fVar60;
        local_1dd8 = BVar27;
        fVar61 = floorf(fVar61 * fVar66);
        local_1e28._0_4_ = fVar61;
        fVar61 = ceilf(fVar57);
        iVar39 = (int)(float)local_1e28._0_4_;
        if ((float)local_1e28._0_4_ <= 0.0) {
          local_1e28._0_4_ = 0.0;
        }
        fVar64 = fVar61;
        if ((float)local_1dd0 <= fVar61) {
          fVar64 = (float)local_1dd0;
        }
        register0x00001204 = extraout_var;
        local_1e48._0_4_ = fVar64;
        if (iVar39 < 0) {
          iVar39 = -1;
        }
        iVar12 = (int)(float)local_1dd0 + 1;
        if ((int)fVar61 < (int)(float)local_1dd0 + 1) {
          iVar12 = (int)fVar61;
        }
        values[0].ref.ptr = (size_t)pGVar10->userPtr;
        local_1df8._0_4_ = (int)(float)local_1e28._0_4_;
        values[0]._12_4_ = (int)(float)local_1e28._0_4_;
        values[0]._8_4_ = uVar4;
        values[0].lbounds.bounds0.lower.field_0._0_8_ = &blower0;
        (**(code **)&pGVar10->field_0x58)(values);
        blower1.lower.field_0._0_8_ = pGVar10->userPtr;
        local_1e18._0_4_ = (int)fVar64;
        blower1.lower.field_0.m128[3] = (float)(int)fVar64;
        blower1.lower.field_0.m128[2] = (float)uVar4;
        blower1.upper.field_0._0_8_ = values;
        (**(code **)&pGVar10->field_0x58)(&blower1);
        local_1e38._0_4_ = local_1e38._0_4_ - (float)local_1e28._0_4_;
        if (iVar12 - iVar39 == 1) {
          if ((float)local_1e38._0_4_ <= 0.0) {
            local_1e38._0_4_ = 0.0;
          }
          fVar61 = 1.0 - (float)local_1e38._0_4_;
          auVar53._0_4_ =
               fVar61 * blower0.lower.field_0.m128[0] +
               (float)local_1e38._0_4_ * (float)values[0].ref.ptr;
          auVar53._4_4_ =
               fVar61 * blower0.lower.field_0.m128[1] +
               (float)local_1e38._0_4_ * values[0].ref.ptr._4_4_;
          auVar53._8_4_ =
               fVar61 * blower0.lower.field_0.m128[2] +
               (float)local_1e38._0_4_ * (float)values[0]._8_4_;
          auVar53._12_4_ =
               fVar61 * blower0.lower.field_0.m128[3] +
               (float)local_1e38._0_4_ * (float)values[0]._12_4_;
          fVar64 = fVar61 * blower0.upper.field_0.m128[0] +
                   (float)local_1e38._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          fVar65 = fVar61 * blower0.upper.field_0.m128[1] +
                   (float)local_1e38._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          fVar67 = fVar61 * blower0.upper.field_0.m128[2] +
                   (float)local_1e38._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          fVar68 = fVar61 * blower0.upper.field_0.m128[3] +
                   (float)local_1e38._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          fVar61 = (float)local_1e48._0_4_ - fVar57;
          if ((float)local_1e48._0_4_ - fVar57 <= 0.0) {
            fVar61 = 0.0;
          }
          fVar57 = 1.0 - fVar61;
          auVar41._0_4_ = (float)values[0].ref.ptr * fVar57 + blower0.lower.field_0.m128[0] * fVar61
          ;
          auVar41._4_4_ = values[0].ref.ptr._4_4_ * fVar57 + blower0.lower.field_0.m128[1] * fVar61;
          auVar41._8_4_ = (float)values[0]._8_4_ * fVar57 + blower0.lower.field_0.m128[2] * fVar61;
          auVar41._12_4_ = (float)values[0]._12_4_ * fVar57 + blower0.lower.field_0.m128[3] * fVar61
          ;
          auVar44._0_4_ =
               fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               fVar61 * blower0.upper.field_0.m128[0];
          auVar44._4_4_ =
               fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               fVar61 * blower0.upper.field_0.m128[1];
          auVar44._8_4_ =
               fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               fVar61 * blower0.upper.field_0.m128[2];
          auVar44._12_4_ =
               fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               fVar61 * blower0.upper.field_0.m128[3];
          uVar32 = local_1e00;
        }
        else {
          bupper0.lower.field_0._0_8_ = pGVar10->userPtr;
          bupper0.lower.field_0.m128[3] = (float)(local_1df8._0_4_ + 1);
          bupper0.lower.field_0.m128[2] = (float)uVar4;
          bupper0.upper.field_0._0_8_ = &blower1;
          (**(code **)&pGVar10->field_0x58)(&bupper0);
          bi.lower.field_0._0_8_ = pGVar10->userPtr;
          bi.lower.field_0.m128[3] = (float)(local_1e18._0_4_ + -1);
          bi.lower.field_0.m128[2] = (float)uVar4;
          bi.upper.field_0._0_8_ = &bupper0;
          (**(code **)&pGVar10->field_0x58)(&bi);
          uVar32 = local_1e00;
          if ((float)local_1e38._0_4_ <= 0.0) {
            local_1e38._0_4_ = 0.0;
          }
          fVar61 = 1.0 - (float)local_1e38._0_4_;
          auVar53._0_4_ =
               blower0.lower.field_0.m128[0] * fVar61 +
               blower1.lower.field_0.m128[0] * (float)local_1e38._0_4_;
          auVar53._4_4_ =
               blower0.lower.field_0.m128[1] * fVar61 +
               blower1.lower.field_0.m128[1] * (float)local_1e38._0_4_;
          auVar53._8_4_ =
               blower0.lower.field_0.m128[2] * fVar61 +
               blower1.lower.field_0.m128[2] * (float)local_1e38._0_4_;
          auVar53._12_4_ =
               blower0.lower.field_0.m128[3] * fVar61 +
               blower1.lower.field_0.m128[3] * (float)local_1e38._0_4_;
          fVar64 = fVar61 * blower0.upper.field_0.m128[0] +
                   (float)local_1e38._0_4_ * blower1.upper.field_0.m128[0];
          fVar65 = fVar61 * blower0.upper.field_0.m128[1] +
                   (float)local_1e38._0_4_ * blower1.upper.field_0.m128[1];
          fVar67 = fVar61 * blower0.upper.field_0.m128[2] +
                   (float)local_1e38._0_4_ * blower1.upper.field_0.m128[2];
          fVar68 = fVar61 * blower0.upper.field_0.m128[3] +
                   (float)local_1e38._0_4_ * blower1.upper.field_0.m128[3];
          fVar61 = (float)local_1e48._0_4_ - fVar57;
          if ((float)local_1e48._0_4_ - fVar57 <= 0.0) {
            fVar61 = 0.0;
          }
          fVar57 = 1.0 - fVar61;
          auVar56._0_8_ =
               CONCAT44(values[0].ref.ptr._4_4_ * fVar57 + bupper0.lower.field_0.m128[1] * fVar61,
                        (float)values[0].ref.ptr * fVar57 + bupper0.lower.field_0.m128[0] * fVar61);
          auVar56._8_4_ = (float)values[0]._8_4_ * fVar57 + bupper0.lower.field_0.m128[2] * fVar61;
          auVar56._12_4_ = (float)values[0]._12_4_ * fVar57 + bupper0.lower.field_0.m128[3] * fVar61
          ;
          auVar50._0_8_ =
               CONCAT44(fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
                        fVar61 * bupper0.upper.field_0.m128[1],
                        fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
                        fVar61 * bupper0.upper.field_0.m128[0]);
          auVar50._8_4_ =
               fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               fVar61 * bupper0.upper.field_0.m128[2];
          auVar50._12_4_ =
               fVar57 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               fVar61 * bupper0.upper.field_0.m128[3];
          iVar39 = iVar39 + 1;
          if (iVar39 < iVar12) {
            do {
              local_1e28._4_4_ = fVar65;
              local_1e28._0_4_ = fVar64;
              uStack_1e20._0_4_ = fVar67;
              uStack_1e20._4_4_ = fVar68;
              fVar61 = ((float)iVar39 / (float)local_1dd0 - fVar66) / (fVar60 - fVar66);
              fVar57 = 1.0 - fVar61;
              local_1e48._4_4_ = fVar57 * fVar65 + fVar61 * auVar50._4_4_;
              local_1e48._0_4_ = fVar57 * fVar64 + fVar61 * auVar50._0_4_;
              uStack_1e40._0_4_ = fVar57 * fVar67 + fVar61 * auVar50._8_4_;
              uStack_1e40._4_4_ = fVar57 * fVar68 + fVar61 * auVar50._12_4_;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_ = pGVar10->userPtr;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[3] = (float)iVar39;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[2] = (float)uVar4;
              _local_1e38 = auVar53;
              _local_1e18 = auVar50;
              _local_1df8 = auVar56;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
              _0_8_ = &bi;
              (**(code **)&pGVar10->field_0x58)(&right);
              auVar42._0_4_ =
                   bi.lower.field_0.m128[0] - (auVar53._0_4_ * fVar57 + auVar56._0_4_ * fVar61);
              auVar42._4_4_ =
                   bi.lower.field_0.m128[1] - (auVar53._4_4_ * fVar57 + auVar56._4_4_ * fVar61);
              auVar42._8_4_ =
                   bi.lower.field_0.m128[2] - (auVar53._8_4_ * fVar57 + auVar56._8_4_ * fVar61);
              auVar42._12_4_ =
                   bi.lower.field_0.m128[3] - (auVar53._12_4_ * fVar57 + auVar56._12_4_ * fVar61);
              auVar45._0_4_ = bi.upper.field_0.m128[0] - (float)local_1e48._0_4_;
              auVar45._4_4_ = bi.upper.field_0.m128[1] - (float)local_1e48._4_4_;
              auVar45._8_4_ = bi.upper.field_0.m128[2] - (float)uStack_1e40;
              auVar45._12_4_ = bi.upper.field_0.m128[3] - uStack_1e40._4_4_;
              auVar43 = minps(auVar42,ZEXT816(0));
              auVar52 = maxps(auVar45,ZEXT816(0));
              auVar53._0_4_ = (float)local_1e38._0_4_ + auVar43._0_4_;
              auVar53._4_4_ = (float)local_1e38._4_4_ + auVar43._4_4_;
              auVar53._8_4_ = (float)uStack_1e30 + auVar43._8_4_;
              auVar53._12_4_ = uStack_1e30._4_4_ + auVar43._12_4_;
              auVar41._0_8_ =
                   CONCAT44(auVar43._4_4_ + (float)local_1df8._4_4_,
                            auVar43._0_4_ + (float)local_1df8._0_4_);
              auVar41._8_4_ = auVar43._8_4_ + (float)uStack_1df0;
              auVar41._12_4_ = auVar43._12_4_ + uStack_1df0._4_4_;
              fVar64 = (float)local_1e28._0_4_ + auVar52._0_4_;
              fVar65 = (float)local_1e28._4_4_ + auVar52._4_4_;
              fVar67 = (float)uStack_1e20 + auVar52._8_4_;
              fVar68 = uStack_1e20._4_4_ + auVar52._12_4_;
              auVar44._0_8_ =
                   CONCAT44(auVar52._4_4_ + (float)local_1e18._4_4_,
                            auVar52._0_4_ + (float)local_1e18._0_4_);
              auVar44._8_4_ = auVar52._8_4_ + (float)uStack_1e10;
              auVar44._12_4_ = auVar52._12_4_ + uStack_1e10._4_4_;
              iVar39 = iVar39 + 1;
              auVar50._8_4_ = auVar44._8_4_;
              auVar50._0_8_ = auVar44._0_8_;
              auVar50._12_4_ = auVar44._12_4_;
              auVar56._8_4_ = auVar41._8_4_;
              auVar56._0_8_ = auVar41._0_8_;
              auVar56._12_4_ = auVar41._12_4_;
            } while (iVar12 != iVar39);
          }
          else {
            auVar41._8_4_ = auVar56._8_4_;
            auVar41._0_8_ = auVar56._0_8_;
            auVar41._12_4_ = auVar56._12_4_;
            auVar44._8_4_ = auVar50._8_4_;
            auVar44._0_8_ = auVar50._0_8_;
            auVar44._12_4_ = auVar50._12_4_;
          }
        }
        aVar48.m128 = (__m128)maxps(aVar48.m128,auVar44);
        local_1a38.m128 = (__m128)minps(local_1a38.m128,auVar41);
        auVar11._4_4_ = fVar65;
        auVar11._0_4_ = fVar64;
        auVar11._8_4_ = fVar67;
        auVar11._12_4_ = fVar68;
        aVar46.m128 = (__m128)maxps(aVar46.m128,auVar11);
        aVar49.m128 = (__m128)minps(aVar49.m128,auVar53);
        BVar27 = (BBox1f)((long)local_1dd8 + 1);
        local_1e00 = uVar32 + 1;
      } while (local_1e00 != local_1de0);
    }
    (local_1de8->ref).ptr = uVar34 | (ulong)pcVar33 | 8;
    (local_1de8->lbounds).bounds0.lower.field_0 = aVar49;
    (local_1de8->lbounds).bounds0.upper.field_0 = aVar46;
    (local_1de8->lbounds).bounds1.lower.field_0 = local_1a38;
    (local_1de8->lbounds).bounds1.upper.field_0 = aVar48;
    local_1de8->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return local_1de8;
  }
  lVar26 = 0xbc;
  do {
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar26 + 4) = 0xffffffff7f800000;
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar26 + 0xc) = 0;
    lVar26 = lVar26 + 0xf0;
  } while (lVar26 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  blower0.upper.field_0._0_8_ = local_1e28;
  blower0.upper.field_0._8_8_ = uStack_1e20;
  local_17a8._0_8_ = local_1e38;
  local_17a8._8_8_ = uStack_1e30;
  local_1788._0_8_ = local_1e48;
  local_1788._8_8_ = uStack_1e40;
  local_1778._0_8_ = local_1e18;
  local_1778._8_8_ = uStack_1e10;
  local_1768._0_8_ = local_1df8;
  local_1768._8_8_ = uStack_1df0;
  local_1748._8_8_ = values[0]._8_8_;
  local_1748._0_8_ = values[0].ref.ptr;
  local_1758[0] = BVar27;
  local_1758[1] = BVar30;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar37;
  local_1718[0].sah = (float)blower0.lower.field_0._0_4_;
  local_1718[0].dim = blower0.lower.field_0._4_4_;
  local_1718[0].mapping.scale.field_0._0_8_ = local_1798._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = local_1798._8_8_;
  local_840 = BVar37;
  local_838[0] = 2;
  local_8c8[0] = &local_840;
  local_1e48 = (undefined1  [8])&local_1b88;
  local_1e18 = (undefined1  [8])&local_1a78;
  local_1dd8 = (BBox1f)&local_1aa8;
  uStack_1e30 = 0x7f8000007f800000;
  local_1e38 = (undefined1  [8])0x7f8000007f800000;
  uStack_1e20 = 0xff800000ff800000;
  local_1e28 = (undefined1  [8])0xff800000ff800000;
  uVar32 = 0;
  blower0.lower.field_0._0_8_ = uVar34;
  local_1798._0_8_ = uVar13;
  local_1798._8_8_ = uVar14;
  do {
    if (local_848 == 0) goto LAB_00c67289;
    lVar26 = -1;
    pBVar29 = local_1758;
    uVar34 = 0;
    uVar35 = 0;
    do {
      uVar36 = (long)pBVar29[1] - (long)*pBVar29;
      if ((((this->cfg).maxLeafSize < uVar36) || (1 < (uint)pBVar29[9].upper)) ||
         ((uVar31 & 1) != 0)) {
        if (uVar34 < uVar36) {
          lVar26 = uVar35;
          uVar34 = uVar36;
        }
        uVar31 = 0;
      }
      uVar35 = uVar35 + 1;
      pBVar29 = pBVar29 + 0x1e;
    } while (local_848 != uVar35);
    if (lVar26 == -1) goto LAB_00c6723f;
    lVar20 = lVar26 * 0xf0;
    blower1.lower.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    local_1b88 = 0xffffffff7f800000;
    uStack_1b80 = 0;
    local_1a78 = 0xffffffff7f800000;
    uStack_1a70 = 0;
    pSVar3 = (Split *)((long)local_1718 + lVar20);
    iVar39 = *(int *)((long)local_1718 + lVar20 + 0xc);
    local_1df8._0_4_ = uVar31;
    local_1dd0 = uVar32;
    bupper0.lower.field_0._0_8_ = blower1.lower.field_0._0_8_;
    if (iVar39 == 0) {
      local_1bc8 = local_1758[lVar26 * 0x1e];
      sStack_1ab0 = *(size_t *)(local_1748 + lVar20 + -8);
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0._8_8_ = 0x7f8000007f800000;
      bi.upper.field_0._0_8_ = 0xff800000ff800000;
      bi.upper.field_0._8_8_ = 0xff800000ff800000;
      local_1d78._0_8_ = 0x7f8000007f800000;
      local_1d78._8_8_ = 0x7f8000007f800000;
      local_1d68._0_8_ = 0xff800000ff800000;
      local_1d68._8_8_ = 0xff800000ff800000;
      local_1d58.m128[0] = INFINITY;
      local_1d58.m128[1] = INFINITY;
      local_1d58._8_8_ = 0x7f8000007f800000;
      local_1d48._0_8_ = 0xff800000ff800000;
      local_1d48.m128[2] = -INFINITY;
      local_1d48.m128[3] = -INFINITY;
      local_1d18 = 0.0;
      local_1d38.lower = 0.0;
      local_1d38.upper = 0.0;
      BStack_1d30.lower = 0.0;
      BStack_1d30.upper = 0.0;
      fStack_1d14 = 1.0;
      fStack_1d10 = 1.0;
      fStack_1d0c = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar20 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar21 = (long)(1 << (*(byte *)((long)local_1718 + lVar20 + 4) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar21);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar21 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = pSVar3;
      BStack_1bc0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                      (*(PrimRefMB **)((long)local_1728[lVar26 * 0x1e] + 0x20),
                                       (size_t)local_1bc8,sStack_1ab0,(EmptyTy *)local_19d8,
                                       (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,
                                       &isLeft,&reduction,&reduction2,0x80,0xc00);
      local_1b98 = local_1728[lVar26 * 0x1e];
      BVar27 = local_1728[lVar26 * 0x1e + -1];
      local_1bf8._8_8_ = 0xff800000ff800000;
      local_1bf8._0_8_ = 0xff800000ff800000;
      blower1.upper.field_0.m128[0] = (float)bi.lower.field_0._0_8_;
      blower1.upper.field_0.m128[1] = (float)((ulong)bi.lower.field_0._0_8_ >> 0x20);
      blower1.upper.field_0.m128[2] = (float)bi.lower.field_0._8_8_;
      blower1.upper.field_0.m128[3] = (float)((ulong)bi.lower.field_0._8_8_ >> 0x20);
      local_1c18._0_8_ = bi.upper.field_0._0_8_;
      local_1c18._8_8_ = bi.upper.field_0._8_8_;
      local_1c08._0_8_ = 0x7f8000007f800000;
      local_1c08._8_8_ = 0x7f8000007f800000;
      local_1be8.lower = INFINITY;
      local_1be8.upper = INFINITY;
      acStack_1be0[0] = '\0';
      acStack_1be0[1] = '\0';
      acStack_1be0[2] = -0x80;
      acStack_1be0[3] = '\x7f';
      acStack_1be0[4] = '\0';
      acStack_1be0[5] = '\0';
      acStack_1be0[6] = -0x80;
      acStack_1be0[7] = '\x7f';
      acStack_1be0[8] = '\0';
      acStack_1be0[9] = '\0';
      acStack_1be0[10] = -0x80;
      acStack_1be0[0xb] = -1;
      acStack_1be0[0xc] = '\0';
      acStack_1be0[0xd] = '\0';
      acStack_1be0[0xe] = -0x80;
      acStack_1be0[0xf] = -1;
      BStack_1bd0.lower = -INFINITY;
      BStack_1bd0.upper = -INFINITY;
      fVar57 = BVar27.lower;
      fVar61 = fVar57;
      if (fVar57 <= BStack_1ba0.lower) {
        fVar61 = BStack_1ba0.lower;
      }
      fVar60 = BVar27.upper;
      if (fVar60 <= BStack_1ba0.upper) {
        BStack_1ba0.upper = fVar60;
      }
      BStack_1ba0.lower = fVar61;
      bupper0.upper.field_0._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      bupper0.upper.field_0._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      aStack_1b00._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      aStack_1b00._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      aStack_1af0._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      aStack_1af0._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      uStack_1ae0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      local_1ad8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                   _0_8_;
      sStack_1ad0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      local_1ac8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                   _0_8_;
      BStack_1ac0.lower =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                  _8_4_;
      BStack_1ac0.upper =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                  _12_4_;
      *(size_t *)((long)local_1dd8 + 0x10) =
           CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
      *(size_t *)((long)local_1dd8 + 0x18) = CONCAT44(right.time_range.upper,right.time_range.lower)
      ;
      *(size_t *)local_1dd8 = right.num_time_segments;
      *(size_t *)((long)local_1dd8 + 8) = right.max_num_time_segments;
      if (fVar57 <= BStack_1a90.lower) {
        BVar27 = (BBox1f)((ulong)BStack_1a90 & 0xffffffff);
      }
      if (fVar60 <= BStack_1a90.upper) {
        BStack_1a90.upper = fVar60;
      }
      BStack_1a90.lower = BVar27.lower;
      local_1ab8 = BStack_1bc0;
      local_1a88 = local_1b98;
LAB_00c66504:
      local_1e50.lower = 0.0;
      local_1e50.upper = 0.0;
      bVar40 = false;
      uVar31 = local_1df8._0_4_;
    }
    else {
      this_00 = (SetMB *)((long)&blower0 + lVar20 + 0x10);
      if (iVar39 != 2) {
        if (iVar39 == 1) {
          SetMB::deterministic_order(this_00);
          splitFallback(this,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
        }
        else if (iVar39 == 3) {
          SetMB::deterministic_order(this_00);
          splitByGeometry(this,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
        }
        goto LAB_00c66504;
      }
      time_range1.lower = *(float *)((long)local_1718 + lVar20 + 8);
      time_range0.lower = local_1728[lVar26 * 0x1e + -1].lower;
      time_range1.upper = local_1728[lVar26 * 0x1e + -1].upper;
      BVar27 = local_1728[lVar26 * 0x1e];
      time_range0.upper = time_range1.lower;
      local_1b98 = (BBox1f)operator_new(0x28);
      pMVar5 = (this->heuristicTemporalSplit).device;
      BVar30 = *(BBox1f *)(local_1748 + lVar20 + -8);
      *(MemoryMonitorInterface **)local_1b98 = pMVar5;
      *(undefined1 *)((long)local_1b98 + 8) = 0;
      *(long *)((long)local_1b98 + 0x10) = 0;
      *(long *)((long)local_1b98 + 0x18) = 0;
      *(long *)((long)local_1b98 + 0x20) = 0;
      lVar21 = (long)BVar30 - (long)local_1758[lVar26 * 0x1e];
      uVar31 = local_1df8._0_4_;
      BVar37 = BVar30;
      if (lVar21 != 0) {
        uVar34 = lVar21 * 0x50;
        local_1e00 = lVar21;
        (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar34,0);
        if (uVar34 < 0x1c00000) {
          pvVar22 = alignedMalloc(uVar34,0x10);
        }
        else {
          pvVar22 = os_malloc(uVar34,(bool *)((long)local_1b98 + 8));
        }
        *(void **)((long)local_1b98 + 0x20) = pvVar22;
        *(ulong *)((long)local_1b98 + 0x10) = local_1e00;
        *(ulong *)((long)local_1b98 + 0x18) = local_1e00;
        BVar30 = local_1758[lVar26 * 0x1e];
        BVar37 = *(BBox1f *)(local_1748 + lVar20 + -8);
      }
      pvVar15 = isLeft.vSplitPos;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      local_1e50 = local_1b98;
      vSplitMask.field_0._0_8_ = BVar27;
      if ((ulong)((long)BVar37 - (long)BVar30) < 0xc00) {
        isLeft.split = (Split *)BVar30;
        isLeft.vSplitPos = (vint *)BVar37;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&bi,(anon_class_40_5_808acc65 *)&vSplitMask,
                   (range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar15,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)BVar37;
        vSplitPos.field_0.v[1] = (longlong)BVar30;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMB *)&bi,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,in_stack_ffffffffffffe188);
        cVar19 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar19 != '\0') {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar25,"task cancelled");
          __cxa_throw(prVar25,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
        uVar31 = local_1df8._0_4_;
      }
      BVar30 = local_1758[lVar26 * 0x1e];
      pcVar38 = *(code **)(local_1748 + lVar20 + -8);
      uVar34 = (long)pcVar38 - (long)BVar30;
      if ((long)BStack_1d30 - (long)local_1d38 != uVar34) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        BStack_1d30 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                        (*(PrimRefMB **)((long)local_1b98 + 0x20),0,uVar34,0x400,
                                         (anon_class_8_1_41ce32a5 *)&right);
        BVar30 = local_1758[lVar26 * 0x1e];
        pcVar38 = *(code **)(local_1748 + lVar20 + -8);
        uVar34 = (long)pcVar38 - (long)BVar30;
      }
      uVar35 = vSplitPos.field_0.v[1];
      blower1.upper.field_0.m128[0] = (float)bi.lower.field_0._0_8_;
      blower1.upper.field_0.m128[1] = (float)((ulong)bi.lower.field_0._0_8_ >> 0x20);
      blower1.upper.field_0.m128[2] = (float)bi.lower.field_0._8_8_;
      blower1.upper.field_0.m128[3] = (float)((ulong)bi.lower.field_0._8_8_ >> 0x20);
      local_1c18._0_8_ = bi.upper.field_0._0_8_;
      local_1c18._8_8_ = bi.upper.field_0._8_8_;
      local_1c08._0_8_ = local_1d78._0_8_;
      local_1c08._8_8_ = local_1d78._8_8_;
      local_1bf8._8_8_ = local_1d68._8_8_;
      local_1bf8._0_8_ = local_1d68._0_8_;
      local_1be8.lower = local_1d58.m128[0];
      local_1be8.upper = local_1d58.m128[1];
      acStack_1be0[0] = local_1d58._8_1_;
      acStack_1be0[1] = local_1d58._9_1_;
      acStack_1be0[2] = local_1d58._10_1_;
      acStack_1be0[3] = local_1d58._11_1_;
      acStack_1be0[4] = local_1d58._12_1_;
      acStack_1be0[5] = local_1d58._13_1_;
      acStack_1be0[6] = local_1d58._14_1_;
      acStack_1be0[7] = local_1d58._15_1_;
      acStack_1be0[8] = local_1d48._0_1_;
      acStack_1be0[9] = local_1d48._1_1_;
      acStack_1be0[10] = local_1d48._2_1_;
      acStack_1be0[0xb] = local_1d48._3_1_;
      acStack_1be0[0xc] = local_1d48._4_1_;
      acStack_1be0[0xd] = local_1d48._5_1_;
      acStack_1be0[0xe] = local_1d48._6_1_;
      acStack_1be0[0xf] = local_1d48._7_1_;
      BStack_1bd0.lower = local_1d48.m128[2];
      BStack_1bd0.upper = local_1d48.m128[3];
      local_1bc8 = local_1d38;
      local_1ba8.upper = fStack_1d14;
      local_1ba8.lower = local_1d18;
      BStack_1ba0 = (BBox1f)(CONCAT44(~-(uint)(fStack_1d0c < time_range0.upper) &
                                      (uint)time_range0.upper,
                                      ~-(uint)(fStack_1d10 < time_range0.lower) & (uint)fStack_1d10)
                            | CONCAT44((uint)fStack_1d0c & -(uint)(fStack_1d0c < time_range0.upper),
                                       (uint)time_range0.lower &
                                       -(uint)(fStack_1d10 < time_range0.lower)));
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      _reduction2 = BVar27;
      if (uVar34 < 0xc00) {
        vSplitPos.field_0.v[0] = (longlong)BVar30;
        vSplitPos.field_0.v[1] = (longlong)pcVar38;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar35,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19d8._8_8_ = &reduction2;
        _reduction = pcVar38;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,in_stack_ffffffffffffe188);
        cVar19 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar19 != '\0') {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar25,"task cancelled");
          __cxa_throw(prVar25,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        uVar31 = local_1df8._0_4_;
      }
      lVar21 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1758 + lVar26 * 0x1e);
      right.object_range._end = lVar21 + right.object_range._begin;
      if (lVar21 != *(unsigned_long *)(local_1748 + lVar20 + -8) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (*(PrimRefMB **)((long)BVar27 + 0x20),right.object_range._begin,
                        *(unsigned_long *)(local_1748 + lVar20 + -8),0x400,
                        (anon_class_8_1_41ce32a6 *)&isLeft);
      }
      bupper0.upper.field_0._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      bupper0.upper.field_0._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      aStack_1b00._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      aStack_1b00._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      aStack_1af0._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      aStack_1af0._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      uStack_1ae0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      local_1ac8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                   _0_8_;
      BStack_1ac0.lower =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                  _8_4_;
      BStack_1ac0.upper =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                  _12_4_;
      *(size_t *)local_1dd8 = right.num_time_segments;
      *(size_t *)((long)local_1dd8 + 8) = right.max_num_time_segments;
      local_1ad8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                   _0_8_;
      sStack_1ad0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      local_1a98.upper = right.max_time_range.upper;
      local_1a98.lower = right.max_time_range.lower;
      BStack_1a90 = (BBox1f)(CONCAT44(~-(uint)(right.time_range.upper < time_range1.upper) &
                                      (uint)time_range1.upper,
                                      ~-(uint)(right.time_range.lower < time_range1.lower) &
                                      (uint)right.time_range.lower) |
                            CONCAT44((uint)right.time_range.upper &
                                     -(uint)(right.time_range.upper < time_range1.upper),
                                     (uint)time_range1.lower &
                                     -(uint)(right.time_range.lower < time_range1.lower)));
      bVar40 = local_1e50 != (BBox1f)0x0;
      BStack_1bc0 = BStack_1d30;
      local_1ab8 = (BBox1f)right.object_range._begin;
      sStack_1ab0 = right.object_range._end;
      local_1a88 = BVar27;
    }
    uVar35 = &bi;
    findFallback((Split *)uVar35,this,(SetMB *)&blower1.upper);
    *(undefined8 *)local_1e48 = bi.lower.field_0._0_8_;
    *(undefined8 *)((long)local_1e48 + 8) = bi.lower.field_0._8_8_;
    local_1b78 = bi.upper.field_0._0_8_;
    local_1b68 = local_1d78._0_8_;
    uStack_1b60 = local_1d78._8_8_;
    local_1b58 = local_1d68._0_8_;
    uStack_1b50 = local_1d68._8_8_;
    findFallback((Split *)uVar35,this,(SetMB *)&bupper0.upper);
    lVar21 = local_640;
    *(undefined8 *)local_1e18 = bi.lower.field_0._0_8_;
    *(undefined8 *)((long)local_1e18 + 8) = bi.lower.field_0._8_8_;
    local_1a68 = bi.upper.field_0._0_8_;
    local_1a58 = local_1d78._0_8_;
    uStack_1a50 = local_1d78._8_8_;
    local_1a48 = local_1d68._0_8_;
    uStack_1a40 = local_1d68._8_8_;
    local_1e50 = (BBox1f)0x0;
    pBVar29 = local_8c8[lVar26];
    if (local_1b98 == *pBVar29) {
      pBVar29[1] = (BBox1f)((long)pBVar29[1] + 1);
      BVar27 = local_1b98;
    }
    else {
      local_640 = local_640 + 1;
      uVar35 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar35 + 0x78) + (lVar21 * 2 + -0xf) * 8) = local_1b98;
      local_838[lVar21 * 2] = 1;
      local_8c8[lVar26] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar35 + 0x78) + (lVar21 * 2 + -0xf) * 8);
      BVar27 = *pBVar29;
    }
    lVar21 = local_640;
    if (local_1a88 == BVar27) {
      local_8c8[local_848] = pBVar29;
      BVar27 = pBVar29[1];
      pBVar29[1] = (BBox1f)((long)BVar27 + 1);
    }
    else {
      local_640 = local_640 + 1;
      uVar35 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar35 + 0x78) + (lVar21 * 2 + -0xf) * 8) = local_1a88;
      local_838[lVar21 * 2] = 1;
      local_8c8[local_848] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar35 + 0x78) + (lVar21 * 2 + -0xf) * 8);
      BVar27 = (BBox1f)((long)pBVar29[1] + -1);
    }
    pBVar29[1] = BVar27;
    if (BVar27 == (BBox1f)0x0) {
      uVar35 = *pBVar29;
      if ((BBox1f)uVar35 != (BBox1f)0x0) {
        lVar21 = *(long *)(uVar35 + 0x18);
        pvVar22 = *(void **)&((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                               *)(uVar35 + 0x20))->field_0x0;
        if (pvVar22 != (void *)0x0) {
          if ((ulong)(lVar21 * 0x50) < 0x1c00000) {
            alignedFree(pvVar22);
          }
          else {
            os_free(pvVar22,lVar21 * 0x50,
                    (bool)*(default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                            *)(uVar35 + 8));
          }
        }
        if (lVar21 != 0) {
          (**(code **)**(undefined8 **)uVar35)(*(undefined8 **)uVar35,lVar21 * -0x50,1);
        }
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar35 + 0x10))->field_0x0 = 0;
        *(undefined8 *)(uVar35 + 0x18) = 0;
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar35 + 0x20))->field_0x0 = 0;
      }
      operator_delete((void *)uVar35);
    }
    *(undefined8 *)((long)&blower0 + lVar20) = blower1.lower.field_0._0_8_;
    *(ulong *)((long)&blower0 + lVar20 + 0x10) =
         CONCAT44(blower1.upper.field_0.m128[1],blower1.upper.field_0.m128[0]);
    *(ulong *)((long)&blower0 + lVar20 + 0x18) =
         CONCAT44(blower1.upper.field_0.m128[3],blower1.upper.field_0.m128[2]);
    *(undefined8 *)(&local_17a8 + lVar26 * 0xf) = local_1c18._0_8_;
    *(undefined8 *)((long)&local_17a8 + lVar26 * 0xf0 + 8) = local_1c18._8_8_;
    *(undefined8 *)((long)&local_1798 + lVar26 * 0xf0) = local_1c08._0_8_;
    *(undefined8 *)((long)&local_1798 + lVar26 * 0xf0U + 8U) = local_1c08._8_8_;
    *(undefined8 *)(&local_1788 + lVar26 * 0xf) = local_1bf8._0_8_;
    *(undefined8 *)((long)&local_1788 + lVar26 * 0xf0 + 8) = local_1bf8._8_8_;
    *(BBox1f *)((long)&local_1778 + lVar26 * 0xf0) = local_1be8;
    *(undefined8 *)((long)&local_1778 + lVar26 * 0xf0U + 8U) = acStack_1be0._0_8_;
    *(undefined8 *)(&local_1768 + lVar26 * 0xf) = acStack_1be0._8_8_;
    local_1758[lVar26 * 0x1e + -1] = BStack_1bd0;
    local_1758[lVar26 * 0x1e] = local_1bc8;
    *(BBox1f *)(local_1748 + lVar20 + -8) = BStack_1bc0;
    *(undefined8 *)(local_1748 + lVar20) = local_1bb8;
    *(undefined8 *)(local_1748 + lVar20 + 8) = uStack_1bb0;
    (&local_1738)[lVar26 * 0x1e] = local_1ba8;
    local_1728[lVar26 * 0x1e + -1] = BStack_1ba0;
    local_1728[lVar26 * 0x1e] = local_1b98;
    uVar13 = *(undefined8 *)local_1e48;
    uVar14 = *(undefined8 *)((long)local_1e48 + 8);
    pSVar3->sah = (float)(int)uVar13;
    pSVar3->dim = (int)((ulong)uVar13 >> 0x20);
    *(undefined8 *)((long)local_1718 + lVar20 + 8) = uVar14;
    uVar34 = local_848;
    *(undefined8 *)((long)local_1718 + lVar26 * 0xf0 + 0x10) = local_1b78;
    *(undefined8 *)((long)local_1718 + lVar26 * 0xf0 + 0x20) = local_1b68;
    *(undefined8 *)((long)local_1718 + (lVar26 * 0x1e + 1) * 8 + 0x20) = uStack_1b60;
    *(undefined8 *)((long)local_1718 + (lVar26 * 0x1e + 2) * 8 + 0x20) = local_1b58;
    *(undefined8 *)((long)local_1718 + (lVar26 * 0x1e + 3) * 8 + 0x20) = uStack_1b50;
    lVar26 = local_848 * 0xf0;
    *(undefined8 *)((long)&blower0 + lVar26) = bupper0.lower.field_0._0_8_;
    *(undefined8 *)((long)&blower0 + lVar26 + 0x10) = bupper0.upper.field_0._0_8_;
    *(undefined8 *)((long)&blower0 + lVar26 + 0x18) = bupper0.upper.field_0._8_8_;
    *(undefined8 *)(&local_17a8 + uVar34 * 0xf) = local_1b08;
    *(undefined8 *)((long)&local_17a8 + uVar34 * 0xf0 + 8) = aStack_1b00._0_8_;
    *(undefined8 *)((long)&local_1798 + uVar34 * 0xf0) = aStack_1b00._8_8_;
    *(undefined8 *)((long)&local_1798 + uVar34 * 0xf0 + 8) = aStack_1af0._0_8_;
    *(undefined8 *)(&local_1788 + uVar34 * 0xf) = aStack_1af0._8_8_;
    *(unsigned_long *)((long)&local_1788 + uVar34 * 0xf0 + 8) = uStack_1ae0;
    *(unsigned_long *)((long)&local_1778 + uVar34 * 0xf0) = local_1ad8;
    *(size_t *)((long)&local_1778 + uVar34 * 0xf0 + 8) = sStack_1ad0;
    *(size_t *)(&local_1768 + uVar34 * 0xf) = local_1ac8;
    local_1758[uVar34 * 0x1e + -1] = BStack_1ac0;
    local_1758[uVar34 * 0x1e] = local_1ab8;
    *(size_t *)(local_1748 + lVar26 + -8) = sStack_1ab0;
    *(size_t *)(local_1748 + lVar26) = local_1aa8;
    *(undefined8 *)(local_1748 + lVar26 + 8) = uStack_1aa0;
    (&local_1738)[uVar34 * 0x1e] = local_1a98;
    local_1728[uVar34 * 0x1e + -1] = BStack_1a90;
    local_1728[uVar34 * 0x1e] = local_1a88;
    uVar13 = *(undefined8 *)((long)local_1e18 + 8);
    *(undefined8 *)((long)local_1718 + lVar26) = *(undefined8 *)local_1e18;
    *(undefined8 *)((long)local_1718 + lVar26 + 8) = uVar13;
    *(undefined8 *)((long)local_1718 + uVar34 * 0xf0 + 0x10) = local_1a68;
    *(undefined8 *)((long)local_1718 + uVar34 * 0xf0 + 0x20) = local_1a58;
    *(undefined8 *)((long)local_1718 + (uVar34 * 0x1e + 1) * 8 + 0x20) = uStack_1a50;
    *(undefined8 *)((long)local_1718 + (uVar34 * 0x1e + 2) * 8 + 0x20) = local_1a48;
    *(undefined8 *)((long)local_1718 + (uVar34 * 0x1e + 3) * 8 + 0x20) = uStack_1a40;
    local_848 = local_848 + 1;
    if (local_1e50 != (BBox1f)0x0) {
      uVar35 = &local_1e50;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar35,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1e50);
    }
    uVar32 = CONCAT71((int7)(local_1dd0 >> 8),(byte)local_1dd0 | bVar40);
  } while (local_848 < (this->cfg).branchingFactor);
  if (local_848 != 0) {
LAB_00c6723f:
    pfVar28 = &fStack_172c;
    uVar34 = local_848;
    do {
      uVar32 = (ulong)(byte)((byte)uVar32 |
                            -(*pfVar28 < *(float *)(local_1a38._0_8_ + 0x9c) ||
                             *(float *)(local_1a38._0_8_ + 0x98) < pfVar28[-1]));
      pfVar28 = pfVar28 + 0x3c;
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
  }
LAB_00c67289:
  if ((uVar32 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar6 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
      bupper0.lower.field_0._8_1_ = 1;
      bupper0.lower.field_0._0_8_ = pTVar6;
      MutexSys::lock(&pTVar6->mutex);
      if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
             ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar6->alloc0).bytesUsed = 0;
      (pTVar6->alloc0).bytesWasted = 0;
      (pTVar6->alloc0).end = 0;
      (pTVar6->alloc0).allocBlockSize = 0;
      (pTVar6->alloc0).ptr = (char *)0x0;
      (pTVar6->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
      }
      else {
        (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar6->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower1.lower.field_0._8_1_ = 1;
      bi.lower.field_0._0_8_ = pTVar6;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar7._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&bi);
      }
      else {
        *iVar7._M_current = (ThreadLocal2 *)bi.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (bupper0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar23 = (alloc.talloc0)->cur;
    uVar34 = (ulong)(-(int)sVar23 & 0xf);
    uVar32 = sVar23 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar34;
    (alloc.talloc0)->cur = uVar32;
    if ((alloc.talloc0)->end < uVar32) {
      (alloc.talloc0)->cur = sVar23;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar33;
        sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar23;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
          (alloc.talloc0)->ptr = pcVar33;
          sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar23;
          (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)blower1.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar33 = (char *)0x0;
            goto LAB_00c67692;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar23;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar34;
      pcVar33 = (alloc.talloc0)->ptr +
                (uVar32 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00c67692:
    pcVar33[0x60] = '\0';
    pcVar33[0x61] = '\0';
    pcVar33[0x62] = -0x80;
    pcVar33[99] = '\x7f';
    pcVar33[100] = '\0';
    pcVar33[0x65] = '\0';
    pcVar33[0x66] = -0x80;
    pcVar33[0x67] = '\x7f';
    pcVar33[0x68] = '\0';
    pcVar33[0x69] = '\0';
    pcVar33[0x6a] = -0x80;
    pcVar33[0x6b] = '\x7f';
    pcVar33[0x6c] = '\0';
    pcVar33[0x6d] = '\0';
    pcVar33[0x6e] = -0x80;
    pcVar33[0x6f] = '\x7f';
    pcVar33[0x40] = '\0';
    pcVar33[0x41] = '\0';
    pcVar33[0x42] = -0x80;
    pcVar33[0x43] = '\x7f';
    pcVar33[0x44] = '\0';
    pcVar33[0x45] = '\0';
    pcVar33[0x46] = -0x80;
    pcVar33[0x47] = '\x7f';
    pcVar33[0x48] = '\0';
    pcVar33[0x49] = '\0';
    pcVar33[0x4a] = -0x80;
    pcVar33[0x4b] = '\x7f';
    pcVar33[0x4c] = '\0';
    pcVar33[0x4d] = '\0';
    pcVar33[0x4e] = -0x80;
    pcVar33[0x4f] = '\x7f';
    pcVar33[0x20] = '\0';
    pcVar33[0x21] = '\0';
    pcVar33[0x22] = -0x80;
    pcVar33[0x23] = '\x7f';
    pcVar33[0x24] = '\0';
    pcVar33[0x25] = '\0';
    pcVar33[0x26] = -0x80;
    pcVar33[0x27] = '\x7f';
    pcVar33[0x28] = '\0';
    pcVar33[0x29] = '\0';
    pcVar33[0x2a] = -0x80;
    pcVar33[0x2b] = '\x7f';
    pcVar33[0x2c] = '\0';
    pcVar33[0x2d] = '\0';
    pcVar33[0x2e] = -0x80;
    pcVar33[0x2f] = '\x7f';
    pcVar33[0x70] = '\0';
    pcVar33[0x71] = '\0';
    pcVar33[0x72] = -0x80;
    pcVar33[0x73] = -1;
    pcVar33[0x74] = '\0';
    pcVar33[0x75] = '\0';
    pcVar33[0x76] = -0x80;
    pcVar33[0x77] = -1;
    pcVar33[0x78] = '\0';
    pcVar33[0x79] = '\0';
    pcVar33[0x7a] = -0x80;
    pcVar33[0x7b] = -1;
    pcVar33[0x7c] = '\0';
    pcVar33[0x7d] = '\0';
    pcVar33[0x7e] = -0x80;
    pcVar33[0x7f] = -1;
    pcVar33[0x50] = '\0';
    pcVar33[0x51] = '\0';
    pcVar33[0x52] = -0x80;
    pcVar33[0x53] = -1;
    pcVar33[0x54] = '\0';
    pcVar33[0x55] = '\0';
    pcVar33[0x56] = -0x80;
    pcVar33[0x57] = -1;
    pcVar33[0x58] = '\0';
    pcVar33[0x59] = '\0';
    pcVar33[0x5a] = -0x80;
    pcVar33[0x5b] = -1;
    pcVar33[0x5c] = '\0';
    pcVar33[0x5d] = '\0';
    pcVar33[0x5e] = -0x80;
    pcVar33[0x5f] = -1;
    pcVar33[0x30] = '\0';
    pcVar33[0x31] = '\0';
    pcVar33[0x32] = -0x80;
    pcVar33[0x33] = -1;
    pcVar33[0x34] = '\0';
    pcVar33[0x35] = '\0';
    pcVar33[0x36] = -0x80;
    pcVar33[0x37] = -1;
    pcVar33[0x38] = '\0';
    pcVar33[0x39] = '\0';
    pcVar33[0x3a] = -0x80;
    pcVar33[0x3b] = -1;
    pcVar33[0x3c] = '\0';
    pcVar33[0x3d] = '\0';
    pcVar33[0x3e] = -0x80;
    pcVar33[0x3f] = -1;
    pcVar33[0x80] = '\0';
    pcVar33[0x81] = '\0';
    pcVar33[0x82] = '\0';
    pcVar33[0x83] = '\0';
    pcVar33[0x84] = '\0';
    pcVar33[0x85] = '\0';
    pcVar33[0x86] = '\0';
    pcVar33[0x87] = '\0';
    pcVar33[0x88] = '\0';
    pcVar33[0x89] = '\0';
    pcVar33[0x8a] = '\0';
    pcVar33[0x8b] = '\0';
    pcVar33[0x8c] = '\0';
    pcVar33[0x8d] = '\0';
    pcVar33[0x8e] = '\0';
    pcVar33[0x8f] = '\0';
    pcVar33[0x90] = '\0';
    pcVar33[0x91] = '\0';
    pcVar33[0x92] = '\0';
    pcVar33[0x93] = '\0';
    pcVar33[0x94] = '\0';
    pcVar33[0x95] = '\0';
    pcVar33[0x96] = '\0';
    pcVar33[0x97] = '\0';
    pcVar33[0x98] = '\0';
    pcVar33[0x99] = '\0';
    pcVar33[0x9a] = '\0';
    pcVar33[0x9b] = '\0';
    pcVar33[0x9c] = '\0';
    pcVar33[0x9d] = '\0';
    pcVar33[0x9e] = '\0';
    pcVar33[0x9f] = '\0';
    pcVar33[0xa0] = '\0';
    pcVar33[0xa1] = '\0';
    pcVar33[0xa2] = '\0';
    pcVar33[0xa3] = '\0';
    pcVar33[0xa4] = '\0';
    pcVar33[0xa5] = '\0';
    pcVar33[0xa6] = '\0';
    pcVar33[0xa7] = '\0';
    pcVar33[0xa8] = '\0';
    pcVar33[0xa9] = '\0';
    pcVar33[0xaa] = '\0';
    pcVar33[0xab] = '\0';
    pcVar33[0xac] = '\0';
    pcVar33[0xad] = '\0';
    pcVar33[0xae] = '\0';
    pcVar33[0xaf] = '\0';
    pcVar33[0xb0] = '\0';
    pcVar33[0xb1] = '\0';
    pcVar33[0xb2] = '\0';
    pcVar33[0xb3] = '\0';
    pcVar33[0xb4] = '\0';
    pcVar33[0xb5] = '\0';
    pcVar33[0xb6] = '\0';
    pcVar33[0xb7] = '\0';
    pcVar33[0xb8] = '\0';
    pcVar33[0xb9] = '\0';
    pcVar33[0xba] = '\0';
    pcVar33[0xbb] = '\0';
    pcVar33[0xbc] = '\0';
    pcVar33[0xbd] = '\0';
    pcVar33[0xbe] = '\0';
    pcVar33[0xbf] = '\0';
    pcVar33[0xc0] = '\0';
    pcVar33[0xc1] = '\0';
    pcVar33[0xc2] = '\0';
    pcVar33[0xc3] = '\0';
    pcVar33[0xc4] = '\0';
    pcVar33[0xc5] = '\0';
    pcVar33[0xc6] = '\0';
    pcVar33[199] = '\0';
    pcVar33[200] = '\0';
    pcVar33[0xc9] = '\0';
    pcVar33[0xca] = '\0';
    pcVar33[0xcb] = '\0';
    pcVar33[0xcc] = '\0';
    pcVar33[0xcd] = '\0';
    pcVar33[0xce] = '\0';
    pcVar33[0xcf] = '\0';
    pcVar33[0xd0] = '\0';
    pcVar33[0xd1] = '\0';
    pcVar33[0xd2] = '\0';
    pcVar33[0xd3] = '\0';
    pcVar33[0xd4] = '\0';
    pcVar33[0xd5] = '\0';
    pcVar33[0xd6] = '\0';
    pcVar33[0xd7] = '\0';
    pcVar33[0xd8] = '\0';
    pcVar33[0xd9] = '\0';
    pcVar33[0xda] = '\0';
    pcVar33[0xdb] = '\0';
    pcVar33[0xdc] = '\0';
    pcVar33[0xdd] = '\0';
    pcVar33[0xde] = '\0';
    pcVar33[0xdf] = '\0';
    pcVar33[0] = '\b';
    pcVar33[1] = '\0';
    pcVar33[2] = '\0';
    pcVar33[3] = '\0';
    pcVar33[4] = '\0';
    pcVar33[5] = '\0';
    pcVar33[6] = '\0';
    pcVar33[7] = '\0';
    pcVar33[8] = '\b';
    pcVar33[9] = '\0';
    pcVar33[10] = '\0';
    pcVar33[0xb] = '\0';
    pcVar33[0xc] = '\0';
    pcVar33[0xd] = '\0';
    pcVar33[0xe] = '\0';
    pcVar33[0xf] = '\0';
    pcVar33[0x10] = '\b';
    pcVar33[0x11] = '\0';
    pcVar33[0x12] = '\0';
    pcVar33[0x13] = '\0';
    pcVar33[0x14] = '\0';
    pcVar33[0x15] = '\0';
    pcVar33[0x16] = '\0';
    pcVar33[0x17] = '\0';
    pcVar33[0x18] = '\b';
    pcVar33[0x19] = '\0';
    pcVar33[0x1a] = '\0';
    pcVar33[0x1b] = '\0';
    pcVar33[0x1c] = '\0';
    pcVar33[0x1d] = '\0';
    pcVar33[0x1e] = '\0';
    pcVar33[0x1f] = '\0';
    uVar32 = 1;
    uVar34 = 0;
    goto LAB_00c676fb;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar6 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
    bupper0.lower.field_0._8_1_ = 1;
    bupper0.lower.field_0._0_8_ = pTVar6;
    MutexSys::lock(&pTVar6->mutex);
    if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
           ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar6->alloc0).bytesUsed = 0;
    (pTVar6->alloc0).bytesWasted = 0;
    (pTVar6->alloc0).end = 0;
    (pTVar6->alloc0).allocBlockSize = 0;
    (pTVar6->alloc0).ptr = (char *)0x0;
    (pTVar6->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar6->alloc1).bytesUsed = 0;
      (pTVar6->alloc1).bytesWasted = 0;
      (pTVar6->alloc1).end = 0;
      (pTVar6->alloc1).allocBlockSize = 0;
      (pTVar6->alloc1).ptr = (char *)0x0;
      (pTVar6->alloc1).cur = 0;
    }
    else {
      (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar6->alloc1).ptr = (char *)0x0;
      (pTVar6->alloc1).cur = 0;
      (pTVar6->alloc1).end = 0;
      (pTVar6->alloc1).allocBlockSize = 0;
      (pTVar6->alloc1).bytesUsed = 0;
      (pTVar6->alloc1).bytesWasted = 0;
      (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar6->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    blower1.lower.field_0._8_1_ = 1;
    bi.lower.field_0._0_8_ = pTVar6;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar7._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&bi);
    }
    else {
      *iVar7._M_current = (ThreadLocal2 *)bi.lower.field_0._0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    uVar35 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (bupper0.lower.field_0._8_1_ == '\x01') {
      uVar35 = bupper0.lower.field_0._0_8_;
      MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar23 = (alloc.talloc0)->cur;
  uVar34 = (ulong)(-(int)sVar23 & 0xf);
  uVar32 = sVar23 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar34;
  (alloc.talloc0)->cur = uVar32;
  if ((alloc.talloc0)->end < uVar32) {
    (alloc.talloc0)->cur = sVar23;
    uVar35 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
      (alloc.talloc0)->ptr = pcVar33;
      sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar23;
      (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)blower1.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        uVar35 = alloc.alloc;
        pcVar33 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar33;
        sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar23;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar33 = (char *)0x0;
          goto LAB_00c67599;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar23;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar34;
    pcVar33 = (alloc.talloc0)->ptr +
              (uVar32 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00c67599:
  pcVar33[0xe0] = '\0';
  pcVar33[0xe1] = '\0';
  pcVar33[0xe2] = -0x80;
  pcVar33[0xe3] = '\x7f';
  pcVar33[0xe4] = '\0';
  pcVar33[0xe5] = '\0';
  pcVar33[0xe6] = -0x80;
  pcVar33[0xe7] = '\x7f';
  pcVar33[0xe8] = '\0';
  pcVar33[0xe9] = '\0';
  pcVar33[0xea] = -0x80;
  pcVar33[0xeb] = '\x7f';
  pcVar33[0xec] = '\0';
  pcVar33[0xed] = '\0';
  pcVar33[0xee] = -0x80;
  pcVar33[0xef] = '\x7f';
  pcVar33[0xf0] = '\0';
  pcVar33[0xf1] = '\0';
  pcVar33[0xf2] = -0x80;
  pcVar33[0xf3] = -1;
  pcVar33[0xf4] = '\0';
  pcVar33[0xf5] = '\0';
  pcVar33[0xf6] = -0x80;
  pcVar33[0xf7] = -1;
  pcVar33[0xf8] = '\0';
  pcVar33[0xf9] = '\0';
  pcVar33[0xfa] = -0x80;
  pcVar33[0xfb] = -1;
  pcVar33[0xfc] = '\0';
  pcVar33[0xfd] = '\0';
  pcVar33[0xfe] = -0x80;
  pcVar33[0xff] = -1;
  pcVar33[0x60] = '\0';
  pcVar33[0x61] = '\0';
  pcVar33[0x62] = -0x80;
  pcVar33[99] = '\x7f';
  pcVar33[100] = '\0';
  pcVar33[0x65] = '\0';
  pcVar33[0x66] = -0x80;
  pcVar33[0x67] = '\x7f';
  pcVar33[0x68] = '\0';
  pcVar33[0x69] = '\0';
  pcVar33[0x6a] = -0x80;
  pcVar33[0x6b] = '\x7f';
  pcVar33[0x6c] = '\0';
  pcVar33[0x6d] = '\0';
  pcVar33[0x6e] = -0x80;
  pcVar33[0x6f] = '\x7f';
  pcVar33[0x40] = '\0';
  pcVar33[0x41] = '\0';
  pcVar33[0x42] = -0x80;
  pcVar33[0x43] = '\x7f';
  pcVar33[0x44] = '\0';
  pcVar33[0x45] = '\0';
  pcVar33[0x46] = -0x80;
  pcVar33[0x47] = '\x7f';
  pcVar33[0x48] = '\0';
  pcVar33[0x49] = '\0';
  pcVar33[0x4a] = -0x80;
  pcVar33[0x4b] = '\x7f';
  pcVar33[0x4c] = '\0';
  pcVar33[0x4d] = '\0';
  pcVar33[0x4e] = -0x80;
  pcVar33[0x4f] = '\x7f';
  pcVar33[0x20] = '\0';
  pcVar33[0x21] = '\0';
  pcVar33[0x22] = -0x80;
  pcVar33[0x23] = '\x7f';
  pcVar33[0x24] = '\0';
  pcVar33[0x25] = '\0';
  pcVar33[0x26] = -0x80;
  pcVar33[0x27] = '\x7f';
  pcVar33[0x28] = '\0';
  pcVar33[0x29] = '\0';
  pcVar33[0x2a] = -0x80;
  pcVar33[0x2b] = '\x7f';
  pcVar33[0x2c] = '\0';
  pcVar33[0x2d] = '\0';
  pcVar33[0x2e] = -0x80;
  pcVar33[0x2f] = '\x7f';
  pcVar33[0x70] = '\0';
  pcVar33[0x71] = '\0';
  pcVar33[0x72] = -0x80;
  pcVar33[0x73] = -1;
  pcVar33[0x74] = '\0';
  pcVar33[0x75] = '\0';
  pcVar33[0x76] = -0x80;
  pcVar33[0x77] = -1;
  pcVar33[0x78] = '\0';
  pcVar33[0x79] = '\0';
  pcVar33[0x7a] = -0x80;
  pcVar33[0x7b] = -1;
  pcVar33[0x7c] = '\0';
  pcVar33[0x7d] = '\0';
  pcVar33[0x7e] = -0x80;
  pcVar33[0x7f] = -1;
  pcVar33[0x50] = '\0';
  pcVar33[0x51] = '\0';
  pcVar33[0x52] = -0x80;
  pcVar33[0x53] = -1;
  pcVar33[0x54] = '\0';
  pcVar33[0x55] = '\0';
  pcVar33[0x56] = -0x80;
  pcVar33[0x57] = -1;
  pcVar33[0x58] = '\0';
  pcVar33[0x59] = '\0';
  pcVar33[0x5a] = -0x80;
  pcVar33[0x5b] = -1;
  pcVar33[0x5c] = '\0';
  pcVar33[0x5d] = '\0';
  pcVar33[0x5e] = -0x80;
  pcVar33[0x5f] = -1;
  pcVar33[0x30] = '\0';
  pcVar33[0x31] = '\0';
  pcVar33[0x32] = -0x80;
  pcVar33[0x33] = -1;
  pcVar33[0x34] = '\0';
  pcVar33[0x35] = '\0';
  pcVar33[0x36] = -0x80;
  pcVar33[0x37] = -1;
  pcVar33[0x38] = '\0';
  pcVar33[0x39] = '\0';
  pcVar33[0x3a] = -0x80;
  pcVar33[0x3b] = -1;
  pcVar33[0x3c] = '\0';
  pcVar33[0x3d] = '\0';
  pcVar33[0x3e] = -0x80;
  pcVar33[0x3f] = -1;
  pcVar33[0x80] = '\0';
  pcVar33[0x81] = '\0';
  pcVar33[0x82] = '\0';
  pcVar33[0x83] = '\0';
  pcVar33[0x84] = '\0';
  pcVar33[0x85] = '\0';
  pcVar33[0x86] = '\0';
  pcVar33[0x87] = '\0';
  pcVar33[0x88] = '\0';
  pcVar33[0x89] = '\0';
  pcVar33[0x8a] = '\0';
  pcVar33[0x8b] = '\0';
  pcVar33[0x8c] = '\0';
  pcVar33[0x8d] = '\0';
  pcVar33[0x8e] = '\0';
  pcVar33[0x8f] = '\0';
  pcVar33[0x90] = '\0';
  pcVar33[0x91] = '\0';
  pcVar33[0x92] = '\0';
  pcVar33[0x93] = '\0';
  pcVar33[0x94] = '\0';
  pcVar33[0x95] = '\0';
  pcVar33[0x96] = '\0';
  pcVar33[0x97] = '\0';
  pcVar33[0x98] = '\0';
  pcVar33[0x99] = '\0';
  pcVar33[0x9a] = '\0';
  pcVar33[0x9b] = '\0';
  pcVar33[0x9c] = '\0';
  pcVar33[0x9d] = '\0';
  pcVar33[0x9e] = '\0';
  pcVar33[0x9f] = '\0';
  pcVar33[0xa0] = '\0';
  pcVar33[0xa1] = '\0';
  pcVar33[0xa2] = '\0';
  pcVar33[0xa3] = '\0';
  pcVar33[0xa4] = '\0';
  pcVar33[0xa5] = '\0';
  pcVar33[0xa6] = '\0';
  pcVar33[0xa7] = '\0';
  pcVar33[0xa8] = '\0';
  pcVar33[0xa9] = '\0';
  pcVar33[0xaa] = '\0';
  pcVar33[0xab] = '\0';
  pcVar33[0xac] = '\0';
  pcVar33[0xad] = '\0';
  pcVar33[0xae] = '\0';
  pcVar33[0xaf] = '\0';
  pcVar33[0xb0] = '\0';
  pcVar33[0xb1] = '\0';
  pcVar33[0xb2] = '\0';
  pcVar33[0xb3] = '\0';
  pcVar33[0xb4] = '\0';
  pcVar33[0xb5] = '\0';
  pcVar33[0xb6] = '\0';
  pcVar33[0xb7] = '\0';
  pcVar33[0xb8] = '\0';
  pcVar33[0xb9] = '\0';
  pcVar33[0xba] = '\0';
  pcVar33[0xbb] = '\0';
  pcVar33[0xbc] = '\0';
  pcVar33[0xbd] = '\0';
  pcVar33[0xbe] = '\0';
  pcVar33[0xbf] = '\0';
  pcVar33[0xc0] = '\0';
  pcVar33[0xc1] = '\0';
  pcVar33[0xc2] = '\0';
  pcVar33[0xc3] = '\0';
  pcVar33[0xc4] = '\0';
  pcVar33[0xc5] = '\0';
  pcVar33[0xc6] = '\0';
  pcVar33[199] = '\0';
  pcVar33[200] = '\0';
  pcVar33[0xc9] = '\0';
  pcVar33[0xca] = '\0';
  pcVar33[0xcb] = '\0';
  pcVar33[0xcc] = '\0';
  pcVar33[0xcd] = '\0';
  pcVar33[0xce] = '\0';
  pcVar33[0xcf] = '\0';
  pcVar33[0xd0] = '\0';
  pcVar33[0xd1] = '\0';
  pcVar33[0xd2] = '\0';
  pcVar33[0xd3] = '\0';
  pcVar33[0xd4] = '\0';
  pcVar33[0xd5] = '\0';
  pcVar33[0xd6] = '\0';
  pcVar33[0xd7] = '\0';
  pcVar33[0xd8] = '\0';
  pcVar33[0xd9] = '\0';
  pcVar33[0xda] = '\0';
  pcVar33[0xdb] = '\0';
  pcVar33[0xdc] = '\0';
  pcVar33[0xdd] = '\0';
  pcVar33[0xde] = '\0';
  pcVar33[0xdf] = '\0';
  pcVar33[0] = '\b';
  pcVar33[1] = '\0';
  pcVar33[2] = '\0';
  pcVar33[3] = '\0';
  pcVar33[4] = '\0';
  pcVar33[5] = '\0';
  pcVar33[6] = '\0';
  pcVar33[7] = '\0';
  pcVar33[8] = '\b';
  pcVar33[9] = '\0';
  pcVar33[10] = '\0';
  pcVar33[0xb] = '\0';
  pcVar33[0xc] = '\0';
  pcVar33[0xd] = '\0';
  pcVar33[0xe] = '\0';
  pcVar33[0xf] = '\0';
  pcVar33[0x10] = '\b';
  pcVar33[0x11] = '\0';
  pcVar33[0x12] = '\0';
  pcVar33[0x13] = '\0';
  pcVar33[0x14] = '\0';
  pcVar33[0x15] = '\0';
  pcVar33[0x16] = '\0';
  pcVar33[0x17] = '\0';
  pcVar33[0x18] = '\b';
  pcVar33[0x19] = '\0';
  pcVar33[0x1a] = '\0';
  pcVar33[0x1b] = '\0';
  pcVar33[0x1c] = '\0';
  pcVar33[0x1d] = '\0';
  pcVar33[0x1e] = '\0';
  pcVar33[0x1f] = '\0';
  uVar34 = CONCAT71(SUB87(uVar35,1),1);
  uVar32 = 6;
LAB_00c676fb:
  local_1e68._8_8_ = 0xff800000ff800000;
  local_1e68._0_8_ = 0xff800000ff800000;
  auVar47 = (undefined1  [8])0x7f8000007f800000;
  uVar35 = 0x7f8000007f800000;
  if (local_848 != 0) {
    local_1e18._0_4_ = (int)uVar34;
    pBVar29 = &values[0].dt;
    uVar34 = 0;
    uStack_1e30 = 0x7f8000007f800000;
    local_1e38 = (undefined1  [8])0x7f8000007f800000;
    uStack_1e40 = 0x7f8000007f800000;
    local_1e48 = (undefined1  [8])0x7f8000007f800000;
    uStack_1e20 = 0xff800000ff800000;
    local_1e28 = (undefined1  [8])0xff800000ff800000;
    local_1e68._8_8_ = 0xff800000ff800000;
    local_1e68._0_8_ = 0xff800000ff800000;
    in_00 = (BuildRecord *)&blower0;
    do {
      createLargeLeaf((NodeRecordMB4D *)&blower1,this,in_00,alloc);
      auVar71 = _DAT_01f80810;
      auVar43 = _DAT_01f80800;
      pBVar29[-10].lower = (float)blower1.lower.field_0._0_4_;
      pBVar29[-10].upper = (float)blower1.lower.field_0._4_4_;
      auVar52._4_4_ = blower1.upper.field_0.m128[1];
      auVar52._0_4_ = blower1.upper.field_0.m128[0];
      auVar52._8_4_ = blower1.upper.field_0.m128[2];
      auVar52._12_4_ = blower1.upper.field_0.m128[3];
      *(undefined1 (*) [16])(pBVar29 + -8) = auVar52;
      auVar55._8_8_ = local_1c18._8_8_;
      auVar55._0_8_ = local_1c18._0_8_;
      *(undefined1 (*) [16])(pBVar29 + -6) = auVar55;
      auVar59._8_8_ = local_1c08._8_8_;
      auVar59._0_8_ = local_1c08._0_8_;
      *(undefined1 (*) [16])(pBVar29 + -4) = auVar59;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
       ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar29 + -2))->m128 = local_1bf8;
      *pBVar29 = local_1be8;
      _local_1e38 = minps(_local_1e38,auVar52);
      _local_1e28 = maxps(_local_1e28,auVar55);
      _local_1e48 = minps(_local_1e48,auVar59);
      local_1e68 = maxps(local_1e68,(undefined1  [16])local_1bf8);
      uVar34 = uVar34 + 1;
      pBVar29 = pBVar29 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar34 < local_848);
    if (((uint)uVar32 | (uint)pcVar33 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar34 = (ulong)pcVar33 & 0xfffffffffffffff0;
        pfVar28 = &values[0].dt.upper;
        lVar26 = 0;
        do {
          *(undefined8 *)(uVar34 + lVar26 * 8) = *(undefined8 *)(pfVar28 + -0x15);
          fVar61 = ((BBox1f *)(pfVar28 + -1))->lower;
          fVar60 = 1.0 / (*pfVar28 - fVar61);
          fVar66 = -fVar61 * fVar60;
          fVar57 = 1.0 - fVar66;
          auVar54._0_4_ = pfVar28[-0x11] * fVar57 + pfVar28[-9] * fVar66;
          auVar54._4_4_ = pfVar28[-0x10] * fVar57 + pfVar28[-8] * fVar66;
          auVar54._8_4_ = pfVar28[-0xf] * fVar57 + pfVar28[-7] * fVar66;
          auVar54._12_4_ = pfVar28[-0xe] * fVar57 + pfVar28[-6] * fVar66;
          auVar58._0_4_ = fVar57 * pfVar28[-0xd] + fVar66 * pfVar28[-5];
          auVar58._4_4_ = fVar57 * pfVar28[-0xc] + fVar66 * pfVar28[-4];
          auVar58._8_4_ = fVar57 * pfVar28[-0xb] + fVar66 * pfVar28[-3];
          auVar58._12_4_ = fVar57 * pfVar28[-10] + fVar66 * pfVar28[-2];
          fVar60 = (1.0 - fVar61) * fVar60;
          fVar61 = 1.0 - fVar60;
          auVar51._0_4_ = pfVar28[-0x11] * fVar61 + pfVar28[-9] * fVar60;
          auVar51._4_4_ = pfVar28[-0x10] * fVar61 + pfVar28[-8] * fVar60;
          auVar51._8_4_ = pfVar28[-0xf] * fVar61 + pfVar28[-7] * fVar60;
          auVar51._12_4_ = pfVar28[-0xe] * fVar61 + pfVar28[-6] * fVar60;
          auVar62._0_4_ = fVar61 * pfVar28[-0xd] + fVar60 * pfVar28[-5];
          auVar62._4_4_ = fVar61 * pfVar28[-0xc] + fVar60 * pfVar28[-4];
          auVar62._8_4_ = fVar61 * pfVar28[-0xb] + fVar60 * pfVar28[-3];
          auVar62._12_4_ = fVar61 * pfVar28[-10] + fVar60 * pfVar28[-2];
          auVar55 = minps(auVar54,auVar71);
          auVar59 = maxps(auVar58,auVar43);
          auVar52 = minps(auVar51,auVar71);
          auVar63 = maxps(auVar62,auVar43);
          fVar61 = auVar55._0_4_ - ABS(auVar55._0_4_) * 4.7683716e-07;
          fVar57 = auVar55._4_4_ - ABS(auVar55._4_4_) * 4.7683716e-07;
          fVar60 = auVar55._8_4_ - ABS(auVar55._8_4_) * 4.7683716e-07;
          fVar66 = ABS(auVar59._0_4_) * 4.7683716e-07 + auVar59._0_4_;
          fVar64 = ABS(auVar59._4_4_) * 4.7683716e-07 + auVar59._4_4_;
          fVar65 = ABS(auVar59._8_4_) * 4.7683716e-07 + auVar59._8_4_;
          *(float *)(uVar34 + 0x20 + lVar26 * 4) = fVar61;
          *(float *)(uVar34 + 0x40 + lVar26 * 4) = fVar57;
          *(float *)(uVar34 + 0x60 + lVar26 * 4) = fVar60;
          *(float *)(uVar34 + 0x30 + lVar26 * 4) = fVar66;
          *(float *)(uVar34 + 0x50 + lVar26 * 4) = fVar64;
          *(float *)(uVar34 + 0x70 + lVar26 * 4) = fVar65;
          *(float *)(uVar34 + 0x80 + lVar26 * 4) =
               (auVar52._0_4_ - ABS(auVar52._0_4_) * 4.7683716e-07) - fVar61;
          *(float *)(uVar34 + 0xa0 + lVar26 * 4) =
               (auVar52._4_4_ - ABS(auVar52._4_4_) * 4.7683716e-07) - fVar57;
          *(float *)(uVar34 + 0xc0 + lVar26 * 4) =
               (auVar52._8_4_ - ABS(auVar52._8_4_) * 4.7683716e-07) - fVar60;
          *(float *)(uVar34 + 0x90 + lVar26 * 4) =
               (ABS(auVar63._0_4_) * 4.7683716e-07 + auVar63._0_4_) - fVar66;
          *(float *)(uVar34 + 0xb0 + lVar26 * 4) =
               (ABS(auVar63._4_4_) * 4.7683716e-07 + auVar63._4_4_) - fVar64;
          *(float *)(uVar34 + 0xd0 + lVar26 * 4) =
               (ABS(auVar63._8_4_) * 4.7683716e-07 + auVar63._8_4_) - fVar65;
          lVar26 = lVar26 + 1;
          pfVar28 = pfVar28 + 0x18;
        } while (local_848 != lVar26);
      }
    }
    else if (local_848 != 0) {
      uVar34 = (ulong)pcVar33 & 0xfffffffffffffff0;
      pfVar28 = &values[0].dt.upper;
      lVar26 = 0;
      do {
        *(undefined8 *)(uVar34 + lVar26 * 8) = *(undefined8 *)(pfVar28 + -0x15);
        fVar61 = *pfVar28;
        fVar57 = ((BBox1f *)(pfVar28 + -1))->lower;
        fVar66 = 1.0 / (fVar61 - fVar57);
        fVar64 = -fVar57 * fVar66;
        fVar60 = 1.0 - fVar64;
        auVar63._0_4_ = pfVar28[-0x11] * fVar60 + pfVar28[-9] * fVar64;
        auVar63._4_4_ = pfVar28[-0x10] * fVar60 + pfVar28[-8] * fVar64;
        auVar63._8_4_ = pfVar28[-0xf] * fVar60 + pfVar28[-7] * fVar64;
        auVar63._12_4_ = pfVar28[-0xe] * fVar60 + pfVar28[-6] * fVar64;
        auVar69._0_4_ = fVar60 * pfVar28[-0xd] + fVar64 * pfVar28[-5];
        auVar69._4_4_ = fVar60 * pfVar28[-0xc] + fVar64 * pfVar28[-4];
        auVar69._8_4_ = fVar60 * pfVar28[-0xb] + fVar64 * pfVar28[-3];
        auVar69._12_4_ = fVar60 * pfVar28[-10] + fVar64 * pfVar28[-2];
        fVar66 = (1.0 - fVar57) * fVar66;
        fVar60 = 1.0 - fVar66;
        auVar71._0_4_ = pfVar28[-0x11] * fVar60 + pfVar28[-9] * fVar66;
        auVar71._4_4_ = pfVar28[-0x10] * fVar60 + pfVar28[-8] * fVar66;
        auVar71._8_4_ = pfVar28[-0xf] * fVar60 + pfVar28[-7] * fVar66;
        auVar71._12_4_ = pfVar28[-0xe] * fVar60 + pfVar28[-6] * fVar66;
        auVar70._0_4_ = fVar60 * pfVar28[-0xd] + fVar66 * pfVar28[-5];
        auVar70._4_4_ = fVar60 * pfVar28[-0xc] + fVar66 * pfVar28[-4];
        auVar70._8_4_ = fVar60 * pfVar28[-0xb] + fVar66 * pfVar28[-3];
        auVar70._12_4_ = fVar60 * pfVar28[-10] + fVar66 * pfVar28[-2];
        auVar55 = minps(auVar63,_DAT_01f80810);
        auVar59 = maxps(auVar69,auVar43);
        auVar52 = minps(auVar71,_DAT_01f80810);
        auVar71 = maxps(auVar70,auVar43);
        fVar65 = auVar55._0_4_ - ABS(auVar55._0_4_) * 4.7683716e-07;
        fVar67 = auVar55._4_4_ - ABS(auVar55._4_4_) * 4.7683716e-07;
        fVar68 = auVar55._8_4_ - ABS(auVar55._8_4_) * 4.7683716e-07;
        fVar60 = ABS(auVar59._0_4_) * 4.7683716e-07 + auVar59._0_4_;
        fVar66 = ABS(auVar59._4_4_) * 4.7683716e-07 + auVar59._4_4_;
        fVar64 = ABS(auVar59._8_4_) * 4.7683716e-07 + auVar59._8_4_;
        *(float *)(uVar34 + 0x20 + lVar26 * 4) = fVar65;
        *(float *)(uVar34 + 0x40 + lVar26 * 4) = fVar67;
        *(float *)(uVar34 + 0x60 + lVar26 * 4) = fVar68;
        *(float *)(uVar34 + 0x30 + lVar26 * 4) = fVar60;
        *(float *)(uVar34 + 0x50 + lVar26 * 4) = fVar66;
        *(float *)(uVar34 + 0x70 + lVar26 * 4) = fVar64;
        *(float *)(uVar34 + 0x80 + lVar26 * 4) =
             (auVar52._0_4_ - ABS(auVar52._0_4_) * 4.7683716e-07) - fVar65;
        *(float *)(uVar34 + 0xa0 + lVar26 * 4) =
             (auVar52._4_4_ - ABS(auVar52._4_4_) * 4.7683716e-07) - fVar67;
        *(float *)(uVar34 + 0xc0 + lVar26 * 4) =
             (auVar52._8_4_ - ABS(auVar52._8_4_) * 4.7683716e-07) - fVar68;
        *(float *)(uVar34 + 0x90 + lVar26 * 4) =
             (ABS(auVar71._0_4_) * 4.7683716e-07 + auVar71._0_4_) - fVar60;
        *(float *)(uVar34 + 0xb0 + lVar26 * 4) =
             (ABS(auVar71._4_4_) * 4.7683716e-07 + auVar71._4_4_) - fVar66;
        *(float *)(uVar34 + 0xd0 + lVar26 * 4) =
             (ABS(auVar71._8_4_) * 4.7683716e-07 + auVar71._8_4_) - fVar64;
        *(float *)(uVar34 + 0xe0 + lVar26 * 4) = fVar57;
        *(uint *)(uVar34 + 0xf0 + lVar26 * 4) =
             ~-(uint)(fVar61 == 1.0) & (uint)fVar61 | -(uint)(fVar61 == 1.0) & 0x3f800001;
        lVar26 = lVar26 + 1;
        pfVar28 = pfVar28 + 0x18;
      } while (local_848 != lVar26);
    }
    uVar34 = (ulong)(uint)local_1e18._0_4_;
    auVar47 = local_1e48;
    uVar35 = uStack_1e40;
  }
  uVar17 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar16 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar34 == '\0') {
    (local_1de8->ref).ptr = uVar32 | (ulong)pcVar33;
    *(undefined1 (*) [8])&(local_1de8->lbounds).bounds0.lower.field_0 = local_1e38;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.lower.field_0 + 8) = uStack_1e30;
    *(undefined1 (*) [8])&(local_1de8->lbounds).bounds0.upper.field_0 = local_1e28;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.upper.field_0 + 8) = uStack_1e20;
    *(undefined1 (*) [8])&(local_1de8->lbounds).bounds1.lower.field_0 = auVar47;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds1.lower.field_0 + 8) = uVar35;
    local_1d68._0_8_ = local_1e68._0_8_;
    local_1d68._8_8_ = local_1e68._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    bupper0.lower.field_0._0_8_ = 0x7f8000007f800000;
    bupper0.lower.field_0._8_8_ = 0x7f8000007f800000;
    bupper0.upper.field_0._0_8_ = 0xff800000ff800000;
    bupper0.upper.field_0._8_8_ = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      blower1.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      blower1.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&blower1);
    }
    else {
      blower1.lower.field_0._12_2_ = 0x401;
      tbb::detail::r1::initialize((task_group_context *)&blower1);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar17;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar16;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&bupper0,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&blower1,in_stack_ffffffffffffe188);
      cVar19 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower1);
      if (cVar19 != '\0') {
        prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar25,"task cancelled");
        __cxa_throw(prVar25,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&blower1);
    }
    (local_1de8->ref).ptr = uVar32 | (ulong)pcVar33;
    *(undefined8 *)&(local_1de8->lbounds).bounds0.lower.field_0 = bi.lower.field_0._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.lower.field_0 + 8) = bi.lower.field_0._8_8_
    ;
    *(undefined8 *)&(local_1de8->lbounds).bounds0.upper.field_0 = bi.upper.field_0._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.upper.field_0 + 8) = bi.upper.field_0._8_8_
    ;
    *(undefined8 *)&(local_1de8->lbounds).bounds1.lower.field_0 = local_1d78._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds1.lower.field_0 + 8) = local_1d78._8_8_;
  }
  *(undefined8 *)&(local_1de8->lbounds).bounds1.upper.field_0 = local_1d68._0_8_;
  *(undefined8 *)((long)&(local_1de8->lbounds).bounds1.upper.field_0 + 8) = local_1d68._8_8_;
  local_1de8->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return local_1de8;
  }
  uVar34 = 0;
  do {
    pBVar8 = local_8c8[uVar34];
    pBVar29 = pBVar8 + 1;
    *pBVar29 = (BBox1f)((long)*pBVar29 + -1);
    if (*pBVar29 == (BBox1f)0x0) {
      BVar27 = *pBVar8;
      if (BVar27 != (BBox1f)0x0) {
        lVar26 = *(long *)((long)BVar27 + 0x18);
        pvVar22 = *(void **)((long)BVar27 + 0x20);
        if (pvVar22 != (void *)0x0) {
          if ((ulong)(lVar26 * 0x50) < 0x1c00000) {
            alignedFree(pvVar22);
          }
          else {
            os_free(pvVar22,lVar26 * 0x50,*(bool *)((long)BVar27 + 8));
          }
        }
        if (lVar26 != 0) {
          (**(code **)**(undefined8 **)BVar27)(*(undefined8 **)BVar27,lVar26 * -0x50,1);
        }
        *(undefined8 *)((long)BVar27 + 0x10) = 0;
        *(undefined8 *)((long)BVar27 + 0x18) = 0;
        *(undefined8 *)((long)BVar27 + 0x20) = 0;
      }
      operator_delete((void *)BVar27);
    }
    uVar34 = uVar34 + 1;
  } while (uVar34 < local_848);
  return local_1de8;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }